

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

bool __thiscall YAML::Emitter::SetBoolFormat(Emitter *this,EMITTER_MANIP value)

{
  bool bVar1;
  EMITTER_MANIP in_ESI;
  EmitterState *in_RDI;
  bool ok;
  uint3 in_stack_fffffffffffffff0;
  value scope;
  byte bVar2;
  
  scope = (value)in_stack_fffffffffffffff0;
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef6fe0);
  bVar1 = EmitterState::SetBoolFormat(in_RDI,in_ESI,scope);
  if (bVar1) {
    scope = CONCAT13(1,(int3)scope);
  }
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7005);
  bVar1 = EmitterState::SetBoolCaseFormat(in_RDI,in_ESI,scope);
  if (bVar1) {
    scope = CONCAT13(1,(int3)scope);
  }
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef702a);
  bVar1 = EmitterState::SetBoolLengthFormat(in_RDI,in_ESI,scope);
  bVar2 = (byte)(scope >> 0x18);
  if (bVar1) {
    bVar2 = 1;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool Emitter::SetBoolFormat(EMITTER_MANIP value) {
  bool ok = false;
  if (m_pState->SetBoolFormat(value, FmtScope::Global))
    ok = true;
  if (m_pState->SetBoolCaseFormat(value, FmtScope::Global))
    ok = true;
  if (m_pState->SetBoolLengthFormat(value, FmtScope::Global))
    ok = true;
  return ok;
}